

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int use_grease(obj *obj)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  obj *obj_00;
  size_t sVar4;
  int iVar5;
  obj *obj_01;
  bool bVar6;
  char buf [256];
  char local_138 [4];
  undefined2 auStack_134 [130];
  
  if (u.uprops[0x29].intrinsic != 0) {
    pcVar2 = Tobjnam(obj,"slip");
    pcVar3 = body_part(3);
    pcVar3 = makeplural(pcVar3);
    pline("%s from your %s.",pcVar2,pcVar3);
    dropx(obj);
    return 1;
  }
  if (obj->spe < '\x01') {
    if ((*(uint *)&obj->field_0x4a & 0x10) == 0) {
      pcVar2 = Tobjnam(obj,"seem");
      pcVar3 = "%s to be empty.";
    }
    else {
      pcVar2 = Tobjnam(obj,"are");
      pcVar3 = "%s empty.";
    }
    iVar5 = 0;
LAB_001453df:
    pline(pcVar3,pcVar2);
LAB_001453e9:
    update_inventory();
    return iVar5;
  }
  if (((((*(uint *)&obj->field_0x4a & 1) != 0) || (u.uprops[0x25].intrinsic != 0)) ||
      (u.uprops[0x25].extrinsic != 0)) && (uVar1 = mt_random(), (uVar1 & 1) == 0)) {
    consume_obj_charge(obj,'\x01');
    pcVar2 = Tobjnam(obj,"slip");
    pcVar3 = body_part(3);
    pcVar3 = makeplural(pcVar3);
    pline("%s from your %s.",pcVar2,pcVar3);
    dropx(obj);
    return 1;
  }
  obj_00 = getobj("\x14\x15","grease",(obj **)0x0);
  if (obj_00 == (obj *)0x0) {
    return 0;
  }
  if ((uarmc != (obj *)0x0 & (byte)obj_00->owornmask) == 1) {
    pcVar2 = xname(uarmc);
    strcpy(local_138,pcVar2);
    goto LAB_0014538b;
  }
  if (((obj_00->owornmask & 0x40U) == 0) || (uarmc == (obj *)0x0 && uarm == (obj *)0x0)) {
    iVar5 = 1;
    consume_obj_charge(obj,'\x01');
    if (obj_00 == &zeroobj) {
      uVar1 = mt_random();
      u.uprops[0x29].intrinsic = uVar1 % 0xf + u.uprops[0x29].intrinsic + 1;
      pcVar2 = body_part(3);
      pcVar2 = makeplural(pcVar2);
      pcVar3 = "You coat your %s with grease.";
    }
    else {
      pcVar2 = yname(obj_00);
      pline("You cover %s with a thick layer of grease.",pcVar2);
      obj_00->field_0x4c = obj_00->field_0x4c | 0x10;
      if (((obj->field_0x4a & 1) == 0) || (((youmonst.data)->mflags1 & 0x2000) != 0))
      goto LAB_001453e9;
      uVar1 = mt_random();
      incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)(uVar1 % 0xf + 1));
      pcVar2 = body_part(6);
      pcVar2 = makeplural(pcVar2);
      pcVar3 = "Some of the grease gets all over your %s.";
    }
    goto LAB_001453df;
  }
  if (uarmc == (obj *)0x0) {
    local_138[0] = '\0';
    obj_01 = uarm;
LAB_0014556a:
    if (obj_01 != (obj *)0x0) goto LAB_0014556f;
    pcVar2 = "";
  }
  else {
    pcVar2 = xname(uarmc);
    obj_01 = uarm;
    bVar6 = uarmc == (obj *)0x0;
    strcpy(local_138,pcVar2);
    if (obj_01 == (obj *)0x0 || bVar6) goto LAB_0014556a;
    sVar4 = strlen(local_138);
    builtin_strncpy(local_138 + sVar4," and",4);
    *(undefined2 *)((long)auStack_134 + sVar4) = 0x20;
LAB_0014556f:
    pcVar2 = xname(obj_01);
  }
  strcat(local_138,pcVar2);
LAB_0014538b:
  pcVar2 = xname(obj_00);
  pline("You need to remove your %s to grease your %s.",local_138,pcVar2);
  return 0;
}

Assistant:

static int use_grease(struct obj *obj)
{
	struct obj *otmp;
	char buf[BUFSZ];
	int res = 0;

	if (Glib) {
	    pline("%s from your %s.", Tobjnam(obj, "slip"),
		  makeplural(body_part(FINGER)));
	    dropx(obj);
	    return 1;
	}

	if (obj->spe > 0) {
		if ((obj->cursed || Fumbling) && !rn2(2)) {
			consume_obj_charge(obj, TRUE);

			pline("%s from your %s.", Tobjnam(obj, "slip"),
			      makeplural(body_part(FINGER)));
			dropx(obj);
			return 1;
		}
		otmp = getobj(lubricables, "grease", NULL);
		if (!otmp) return 0;
		if ((otmp->owornmask & WORN_ARMOR) && uarmc) {
			strcpy(buf, xname(uarmc));
			pline(need_to_remove_outer_armor, buf, xname(otmp));
			return 0;
		}
		if ((otmp->owornmask & WORN_SHIRT) && (uarmc || uarm)) {
			strcpy(buf, uarmc ? xname(uarmc) : "");
			if (uarmc && uarm) strcat(buf, " and ");
			strcat(buf, uarm ? xname(uarm) : "");
			pline(need_to_remove_outer_armor, buf, xname(otmp));
			return 0;
		}
		consume_obj_charge(obj, TRUE);
		res = 1;

		if (otmp != &zeroobj) {
			pline("You cover %s with a thick layer of grease.",
			    yname(otmp));
			otmp->greased = 1;
			if (obj->cursed && !nohands(youmonst.data)) {
			    incr_itimeout(&Glib, rnd(15));
			    pline("Some of the grease gets all over your %s.",
				makeplural(body_part(HAND)));
			}
		} else {
			Glib += rnd(15);
			pline("You coat your %s with grease.",
			    makeplural(body_part(FINGER)));
		}
	} else {
	    if (obj->known)
		pline("%s empty.", Tobjnam(obj, "are"));
	    else
		pline("%s to be empty.", Tobjnam(obj, "seem"));
	}
	update_inventory();
	return res;
}